

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

void __thiscall
Memory::
PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
::ReleasePages(PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
               *this,void *address,uint pageCount,void *segmentParam)

{
  HANDLE pVVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  HANDLE pVVar6;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList_00;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar7;
  undefined8 *in_FS_OFFSET;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromSegmentList;
  PageSegmentBase<Memory::VirtualAllocWrapper> *segment;
  void *segmentParam_local;
  uint pageCount_local;
  void *address_local;
  PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
  *this_local;
  
  if (this->maxAllocPageCount < pageCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x635,"(pageCount <= this->maxAllocPageCount)",
                       "pageCount <= this->maxAllocPageCount");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar3 = ValidThreadAccess(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x637,"(this->ValidThreadAccess())",
                       "Page allocation should only be used by a single thread");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  uVar4 = (*this->_vptr_PageAllocatorBase[3])();
  if ((uVar4 & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x638,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->disablePageReuse & 1U) == 0) {
    PageTracking::ReportFree(this,address,(ulong)(pageCount << 0xc));
    fromSegmentList_00 =
         GetSegmentList(this,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    if (fromSegmentList_00 ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x647,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    if ((ulong)this->maxFreePageCount < this->freePageCount + (ulong)pageCount) {
      bVar3 = ZeroPages(this);
      if ((bVar3) ||
         (bVar3 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Empty
                            (&this->emptySegments), bVar3)) {
        PageSegmentBase<Memory::VirtualAllocWrapper>::DecommitPages<false>
                  ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,address,pageCount);
        LogFreePages(this,(ulong)pageCount);
        LogDecommitPages(this,(ulong)pageCount);
        this->decommitPageCount = (ulong)pageCount + this->decommitPageCount;
      }
      else {
        pPVar7 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                           (&this->emptySegments);
        uVar5 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetDecommitPageCount(pPVar7);
        if (uVar5 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x65f,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                             "emptySegments.Head().GetDecommitPageCount() == 0");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        pPVar7 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Head
                           (&this->emptySegments);
        LogFreeSegment(this,&pPVar7->super_SegmentBase<Memory::VirtualAllocWrapper>);
        DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::
        RemoveHead<Memory::NoThrowHeapAllocator>
                  (&this->emptySegments,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
        this->freePageCount = this->freePageCount - (ulong)this->maxAllocPageCount;
        if (this->freePageCount < this->debugMinFreePageCount) {
          this->debugMinFreePageCount = this->freePageCount;
        }
        MemSetLocal(this,address,0xfe,(ulong)(pageCount << 0xc));
        PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages
                  ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,address,pageCount);
        LogFreePages(this,(ulong)pageCount);
        AddFreePageCount(this,pageCount);
      }
    }
    else {
      if (((Js::Configuration::Global[0x2c158] & 1) != 0) && (bVar3 = QueueZeroPages(this), bVar3))
      {
        bVar3 = HasZeroPageQueue(this);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x67e,"(HasZeroPageQueue())","HasZeroPageQueue()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        AddPageToZeroQueue(this,address,pageCount,
                           (PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
        return;
      }
      FillFreePages(this,address,pageCount);
      PageSegmentBase<Memory::VirtualAllocWrapper>::ReleasePages
                ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,address,pageCount);
      LogFreePages(this,(ulong)pageCount);
      AddFreePageCount(this,pageCount);
    }
    TransferSegment(this,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,
                    fromSegmentList_00);
  }
  else {
    pVVar1 = this->processHandle;
    pVVar6 = GetCurrentProcess();
    if (pVVar1 != pVVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x63d,"(this->processHandle == GetCurrentProcess())",
                         "this->processHandle == GetCurrentProcess()");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    VirtualFree(address,(ulong)(pageCount << 0xc),0x4000);
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::ReleasePages(__in void * address, uint pageCount, __in void * segmentParam)
{
    Assert(pageCount <= this->maxAllocPageCount);
    TPageSegment * segment = (TPageSegment*) segmentParam;
    ASSERT_THREAD();
    Assert(!this->HasMultiThreadAccess());

#ifdef RECYCLER_NO_PAGE_REUSE
    if (disablePageReuse)
    {
        Assert(this->processHandle == GetCurrentProcess());
#pragma prefast(suppress:6250, "Calling 'VirtualFree' without the MEM_RELEASE flag might free memory but not address descriptors (VADs).")
        VirtualFree(address, pageCount * AutoSystemInfo::PageSize, MEM_DECOMMIT);
        return;
    }
#endif

    PageTracking::ReportFree((PageAllocator*)this, address, AutoSystemInfo::PageSize * pageCount);

    DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
    Assert(fromSegmentList != nullptr);

    /**
     * The logic here is as follows:
     * - If we have sufficient pages already, such that the newly free pages are going
     *   to cause us to exceed the threshold of free pages we want:
     *     - First check and see if we have empty segments. If we do, just release that
     *       entire segment back to the operating system, and add the current segments
     *       free pages to our free page pool
     *     - Otherwise, if there are no empty segments (i.e our memory is fragmented),
     *       decommit the pages that are being released so that they don't count towards
     *       our working set
     * - If we don't have enough pages:
     *    - If we're in the free page queuing mode where we have a "pages to zero out" queue
     *      put it in that queue and we're done
     *    - Otherwise, zero it out, and add it to the free page pool
     *  Now that we've either decommitted or freed the pages in the segment,
     *  move the segment to the right segment list
     */
    if (this->freePageCount + pageCount > maxFreePageCount)
    {
        // Release a whole segment if possible to reduce the number of VirtualFree and fragmentation
        if (!ZeroPages() && !emptySegments.Empty())
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);
            this->freePageCount -= maxAllocPageCount;

#if DBG
            UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
            MemSetLocal(address, DbgMemFill, AutoSystemInfo::PageSize * pageCount);
#endif
            segment->ReleasePages(address, pageCount);
            LogFreePages(pageCount);
            this->AddFreePageCount(pageCount);

        }
        else
        {
            segment->template DecommitPages<false>(address, pageCount);
            LogFreePages(pageCount);
            LogDecommitPages(pageCount);
#if DBG_DUMP
            this->decommitPageCount += pageCount;
#endif
        }
    }
    else
    {
#if ENABLE_BACKGROUND_PAGE_ZEROING
        if (CONFIG_FLAG(EnableBGFreeZero))
        {
            if (QueueZeroPages())
            {
                Assert(HasZeroPageQueue());
                AddPageToZeroQueue(address, pageCount, segment);
                return;
            }
        }
#endif

        this->FillFreePages((char *)address, pageCount);
        segment->ReleasePages(address, pageCount);
        LogFreePages(pageCount);
        this->AddFreePageCount(pageCount);
    }

    TransferSegment(segment, fromSegmentList);
}